

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsp.hh
# Opt level: O2

PathResult
wsp(Position *start,function<bool_(Position)> *reached_end,State *state,
   function<int_(Position)> *cell_cost)

{
  CostPathStep *this;
  char cVar1;
  Direction DVar2;
  Direction DVar3;
  pointer piVar4;
  pointer pCVar5;
  bool bVar6;
  int iVar7;
  vector<char,_std::allocator<char>_> *pvVar8;
  char *pcVar9;
  Direction unaff_RBX;
  Position PVar10;
  size_type __n;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  reference rVar14;
  PathResult PVar15;
  allocator_type local_b2;
  allocator_type local_b1;
  char *local_b0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  char *local_90;
  priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
  local_88;
  function<int_(Position)> *local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  C;
  
  local_60 = cell_cost;
  bVar6 = std::function<bool_(Position)>::operator()(reached_end,*start);
  if (bVar6) {
    uVar13 = 1;
    unaff_RBX = Direction::STAY;
  }
  else {
    local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_start = (CostPathStep *)0x0;
    local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_finish = (CostPathStep *)0x0;
    local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    C.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    C.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    C.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<CostPathStep,_std::allocator<CostPathStep>_>::~_Vector_base
              ((_Vector_base<CostPathStep,_std::allocator<CostPathStep>_> *)&C);
    SeenMatrix::reset();
    iVar7 = (state->maze).r;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_a8,(long)(state->maze).c,&MAXINT,
               &local_b1);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&C,(long)iVar7,(value_type *)&local_a8,&local_b2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (SeenMatrix::S.
                        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + start->i,(long)start->j);
    *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
    pvVar8 = PathMagic::dirs(start);
    local_90 = (pvVar8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    pcVar9 = (pvVar8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (pcVar9 != local_90) {
      cVar1 = *pcVar9;
      uVar12 = (long)Direction::LIST[cVar1].i + (long)start->i;
      lVar11 = (long)Direction::LIST[cVar1].j + (long)start->j;
      PVar10 = (Position)(uVar12 & 0xffffffff | lVar11 << 0x20);
      local_b0 = pcVar9;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           std::function<int_(Position)>::operator()(local_60,PVar10);
      C.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[lVar11]
           = (int)local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(Direction::LIST + cVar1);
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)PVar10;
      std::
      priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
      ::push(&local_88,(value_type *)&local_a8);
      unaff_RBX = (Direction)start;
      pcVar9 = local_b0 + 1;
    }
    while (local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      bVar6 = std::function<bool_(Position)>::operator()
                        (reached_end,
                         (local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pos);
      pCVar5 = local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar6) {
        if (local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar13 = 0;
        }
        else {
          unaff_RBX = (local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_start)->initial;
          uVar13 = 1;
        }
        goto LAB_001062a4;
      }
      local_b0 = (char *)(long)((local_88.c.
                                 super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->pos).i;
      __n = (size_type)
            ((local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
              super__Vector_impl_data._M_start)->pos).j;
      DVar2 = (local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
               super__Vector_impl_data._M_start)->initial;
      if (0x14 < (long)local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
        this = local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].cost;
        local_a8._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].pos;
        local_a8._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              &local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].initial;
        CostPathStep::operator=
                  (this,local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<CostPathStep*,std::vector<CostPathStep,std::allocator<CostPathStep>>>,long,CostPathStep,__gnu_cxx::__ops::_Iter_comp_iter<wsp(Position_const&,std::function<bool(Position)>,State_const&,std::function<int(Position)>)::__0>>
                  (pCVar5,0,((long)this - (long)pCVar5) / 0x14);
      }
      pcVar9 = local_b0;
      local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (SeenMatrix::S.
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_b0,__n);
      if ((*rVar14._M_p & rVar14._M_mask) == 0) {
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (SeenMatrix::S.
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)pcVar9,__n);
        *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
        local_90 = (char *)((long)local_b0 * 0x18);
        iVar7 = PathMagic::index_from_pos.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_b0].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[__n];
        DVar3 = (Direction)
                PathMagic::valid_dirs.
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
        for (unaff_RBX = *(Direction *)
                          (PathMagic::valid_dirs.
                           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar7); unaff_RBX != DVar3;
            unaff_RBX = (Direction)((long)unaff_RBX + 1)) {
          pcVar9 = local_b0 + Direction::LIST[*(char *)unaff_RBX].i;
          lVar11 = (long)Direction::LIST[*(char *)unaff_RBX].j + __n;
          PVar10 = (Position)((ulong)pcVar9 & 0xffffffff | lVar11 << 0x20);
          iVar7 = std::function<int_(Position)>::operator()(local_60,PVar10);
          iVar7 = iVar7 + *(int *)(*(long *)(local_90 +
                                            (long)&(C.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<int,_std::allocator<int>_>) +
                                  __n * 4) + 1;
          piVar4 = C.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pcVar9].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if (iVar7 < piVar4[lVar11]) {
            piVar4[lVar11] = iVar7;
            local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)PVar10;
            local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)DVar2;
            local_a8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar7;
            std::
            priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
            ::push(&local_88,(value_type *)&local_a8);
          }
        }
      }
    }
    uVar13 = 0;
LAB_001062a4:
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&C);
    std::_Vector_base<CostPathStep,_std::allocator<CostPathStep>_>::~_Vector_base
              ((_Vector_base<CostPathStep,_std::allocator<CostPathStep>_> *)&local_88);
  }
  PVar15.found = (bool)(char)uVar13;
  PVar15._9_3_ = (int3)((ulong)uVar13 >> 8);
  PVar15.dist = (int)((ulong)uVar13 >> 0x20);
  PVar15.dir = unaff_RBX;
  return PVar15;
}

Assistant:

PathResult wsp(const Position& start,
                          function<bool(Position)> reached_end,
                          const State& state,
                          function<int(Position)> cell_cost) {

    if (reached_end(start)) return PathResult(Direction::STAY, 0);

    auto comp = [](const CostPathStep& a, const CostPathStep& b) {
        return a.cost > b.cost;
    };

    priority_queue<CostPathStep, vector<CostPathStep>, decltype(comp)> Q(comp);
    SeenMatrix::reset();
    vector<vector<bool>>& S = SeenMatrix::S;
    vector<vector<int>> C(state.maze.rows(), vector<int>(state.maze.cols(), MAXINT));

    S[start.i][start.j] = true;

    for (char d : PathMagic::dirs(start)) {
        const Direction& dir = Direction::LIST[(int)d];
        Position s = start.move_destination(dir);

        C[s.i][s.j] = cell_cost(s);
        Q.push(CostPathStep(s, dir, C[s.i][s.j]));
    }

    while (not Q.empty() and not reached_end(Q.top().pos)) {
        CostPathStep a = Q.top(); Q.pop();
        if (not S[a.pos.i][a.pos.j]) {
            S[a.pos.i][a.pos.j] = true;
            for (char d : PathMagic::dirs(a.pos)) {
                const Direction& dir = Direction::LIST[(int)d];
                Position s = a.pos.move_destination(dir);
                int c = cell_cost(s) + 1;
                if (C[a.pos.i][a.pos.j] + c < C[s.i][s.j]) {
                    C[s.i][s.j] = C[a.pos.i][a.pos.j] + c;
                    Q.push(CostPathStep(s, a.initial, C[s.i][s.j]));
    }   }   }   }

    return Q.empty() ? PathResult(false) : PathResult(Q.top().initial, 0);
}